

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O2

void __thiscall lunasvg::Bitmap::convertToRGBA(Bitmap *this)

{
  int width;
  int height;
  int stride;
  uchar *dst;
  
  if (this->m_surface != (plutovg_surface_t *)0x0) {
    dst = plutovg_surface_get_data(this->m_surface);
    width = plutovg_surface_get_width(this->m_surface);
    height = plutovg_surface_get_height(this->m_surface);
    stride = plutovg_surface_get_stride(this->m_surface);
    plutovg_convert_argb_to_rgba(dst,dst,width,height,stride);
    return;
  }
  return;
}

Assistant:

void Bitmap::convertToRGBA()
{
    if(m_surface == nullptr)
        return;
    auto data = plutovg_surface_get_data(m_surface);
    auto width = plutovg_surface_get_width(m_surface);
    auto height = plutovg_surface_get_height(m_surface);
    auto stride = plutovg_surface_get_stride(m_surface);
    plutovg_convert_argb_to_rgba(data, data, width, height, stride);
}